

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomNodeList __thiscall QDomNode::childNodes(QDomNode *this)

{
  QDomNodeListPrivate *this_00;
  long *in_RSI;
  QDomNodeListPrivate *in_RDI;
  QDomNodePrivate *in_stack_ffffffffffffffc8;
  
  if (*in_RSI == 0) {
    QDomNodeList::QDomNodeList((QDomNodeList *)in_RDI);
  }
  else {
    this_00 = (QDomNodeListPrivate *)operator_new(0x60);
    QDomNodeListPrivate::QDomNodeListPrivate(this_00,in_stack_ffffffffffffffc8);
    QDomNodeList::QDomNodeList((QDomNodeList *)in_RDI,this_00);
  }
  return (QDomNodeList)in_RDI;
}

Assistant:

QDomNodeList QDomNode::childNodes() const
{
    if (!impl)
        return QDomNodeList();
    return QDomNodeList(new QDomNodeListPrivate(impl));
}